

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypt.c
# Opt level: O0

int ulp_encrypt(uint8_t *msg,ulp_public_key *pub_key,ulp_ciphertext **ciphertext_p)

{
  int iVar1;
  ulp_ciphertext *puVar2;
  void *__ptr;
  uint64_t *buffer;
  uint64_t uVar3;
  uint64_t uVar4;
  undefined8 *in_RDX;
  ulong *in_RSI;
  uint8_t *in_RDI;
  size_t j_1;
  size_t i_1;
  size_t j;
  size_t i;
  int err;
  uint64_t *encoded;
  uint64_t *e1;
  ulp_ciphertext *ciphertext;
  uint64_t in_stack_ffffffffffffff90;
  uint64_t in_stack_ffffffffffffff98;
  uint64_t in_stack_ffffffffffffffa0;
  ulong local_58;
  ulong local_50;
  uint64_t in_stack_ffffffffffffffb8;
  ulong uVar5;
  uint in_stack_ffffffffffffffc0;
  int iVar6;
  
  if ((in_RDI != (uint8_t *)0x0) && (in_RSI != (ulong *)0x0)) {
    puVar2 = ulp_alloc_ciphertext(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    __ptr = malloc(*in_RSI << 3);
    buffer = (uint64_t *)malloc(in_RSI[1] << 3);
    if ((puVar2 != (ulp_ciphertext *)0x0) && ((__ptr != (void *)0x0 && (buffer != (uint64_t *)0x0)))
       ) {
      iVar6 = 0;
      iVar1 = get_random_numbers(buffer,(ulong)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      iVar1 = iVar1 + iVar6;
      iVar6 = get_random_numbers(buffer,CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                                 in_stack_ffffffffffffffb8);
      iVar6 = iVar6 + iVar1;
      iVar1 = get_random_numbers(buffer,CONCAT44(iVar6,in_stack_ffffffffffffffc0),
                                 in_stack_ffffffffffffffb8);
      if (iVar1 + iVar6 == 0) {
        encode(in_RDI,buffer,in_RSI[1],in_RSI[2]);
        for (uVar5 = 0; uVar5 < *in_RSI; uVar5 = uVar5 + 1) {
          for (local_50 = 0; local_50 < *in_RSI; local_50 = local_50 + 1) {
            in_stack_ffffffffffffff98 = puVar2->c1[uVar5];
            uVar3 = mulmod(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
                           in_stack_ffffffffffffff90);
            puVar2->c1[uVar5] = (in_stack_ffffffffffffff98 + uVar3) % in_RSI[2];
          }
        }
        for (local_58 = 0; local_58 < in_RSI[1]; local_58 = local_58 + 1) {
          puVar2->c2[local_58] = (puVar2->c2[local_58] + buffer[local_58]) % in_RSI[2];
          for (uVar5 = 0; uVar5 < *in_RSI; uVar5 = uVar5 + 1) {
            uVar3 = puVar2->c2[local_58];
            uVar4 = mulmod(uVar5,in_stack_ffffffffffffff98,uVar3);
            puVar2->c2[local_58] = (uVar3 + uVar4) % in_RSI[2];
          }
        }
        free(__ptr);
        free(buffer);
        *in_RDX = puVar2;
        return 0;
      }
    }
    ulp_free_ciphertext((ulp_ciphertext *)0x102165);
    free(__ptr);
    free(buffer);
  }
  return -1;
}

Assistant:

int ulp_encrypt(uint8_t msg[], ulp_public_key* pub_key, ulp_ciphertext** ciphertext_p) {

    if(msg == NULL || pub_key == NULL)
        return -1;

    // allocate memory for ciphertext and other buffers
    ulp_ciphertext* ciphertext = ulp_alloc_ciphertext(pub_key->n, pub_key->l);
    uint64_t* e1 = malloc(pub_key->n * sizeof(pub_key->se));
    uint64_t* encoded = malloc(pub_key->l * sizeof(pub_key->q));
    if(ciphertext == NULL || e1 == NULL || encoded == NULL)
        goto fail;

    // gather random data for e1, e2 and e3
    int err = 0;
    err += get_random_numbers(e1, pub_key->n, pub_key->se);
    err += get_random_numbers(ciphertext->c1, pub_key->n, pub_key->se);
    err += get_random_numbers(ciphertext->c2, pub_key->l, pub_key->se);
    if(err != 0)
        goto fail;

    // encode input
    encode(msg, encoded, pub_key->l, pub_key->q);

    // c1 = A*e1 + e2
    for(size_t i = 0; i < pub_key->n; i++) {
        for(size_t j = 0; j < pub_key->n; j++) {
            ciphertext->c1[i] = (ciphertext->c1[i] + mulmod(pub_key->A[i*pub_key->n + j], e1[j], pub_key->q)) % pub_key->q;
        }
    }

    // c2 = P*e1 + e3 + encoded(msg)
    for(size_t i = 0; i < pub_key->l; i++) {
        ciphertext->c2[i] = (ciphertext->c2[i] + encoded[i]) % pub_key->q;
        for(size_t j = 0; j < pub_key->n; j++) {
            ciphertext->c2[i] = (ciphertext->c2[i] + mulmod(pub_key->P[i*pub_key->n + j], e1[j], pub_key->q)) % pub_key->q;
        }
    }

    // exit properly
    free(e1);
    free(encoded);
    *ciphertext_p = ciphertext;
    return 0;


    fail:
        ulp_free_ciphertext(ciphertext);
        free(e1);
        free(encoded);
        return -1;

}